

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_threadprivate.cpp
# Opt level: O2

private_common * kmp_threadprivate_insert(int gtid,void *pc_addr,void *data_addr,size_t pc_size)

{
  size_t size;
  common_table *pcVar1;
  private_common *ppVar2;
  kmp_info_t *pkVar3;
  kmp_info_t **ppkVar4;
  private_common *ppVar5;
  shared_common *psVar6;
  void *pvVar7;
  ulong uVar8;
  kmpc_cctor p_Var9;
  private_data *ppVar10;
  void *pc_addr_00;
  int gtid_00;
  void *pvVar11;
  uint uVar12;
  kmp_msg_t local_48;
  
  gtid_00 = gtid;
  __kmp_acquire_ticket_lock(&__kmp_global_lock,gtid);
  ppVar5 = (private_common *)___kmp_allocate(0x28);
  ppVar5->gbl_addr = pc_addr;
  psVar6 = __kmp_find_shared_task_common((shared_table *)pc_addr,gtid_00,pc_addr_00);
  uVar12 = (uint)pc_addr;
  if (psVar6 == (shared_common *)0x0) {
    psVar6 = (shared_common *)___kmp_allocate(0x50);
    psVar6->gbl_addr = pc_addr;
    psVar6->cmn_size = pc_size;
    ppVar10 = __kmp_init_common_data(data_addr,pc_size);
    psVar6->pod_init = ppVar10;
    uVar8 = (ulong)(uVar12 & 0xff8);
    psVar6->next = *(shared_common **)((long)__kmp_threadprivate_d_table.data + uVar8);
    *(shared_common **)((long)__kmp_threadprivate_d_table.data + uVar8) = psVar6;
  }
  else if ((psVar6->pod_init == (private_data *)0x0) && (psVar6->obj_init == (void *)0x0)) {
    psVar6->cmn_size = pc_size;
    if (psVar6->is_vec == 0) {
      if ((psVar6->ct).ctor != (kmpc_ctor)0x0) goto LAB_00139cf6;
      if ((psVar6->cct).cctor == (kmpc_cctor)0x0) goto LAB_00139d22;
      pvVar7 = ___kmp_allocate(pc_size);
      psVar6->obj_init = pvVar7;
      (*(psVar6->cct).cctor)(pvVar7,pc_addr);
    }
    else if ((psVar6->ct).ctor == (kmpc_ctor)0x0) {
      if ((psVar6->cct).cctor == (kmpc_cctor)0x0) {
LAB_00139d22:
        ppVar10 = __kmp_init_common_data(data_addr,pc_size);
        psVar6->pod_init = ppVar10;
      }
      else {
        pvVar7 = ___kmp_allocate(pc_size);
        psVar6->obj_init = pvVar7;
        (*(psVar6->cct).cctor)(pvVar7,pc_addr);
      }
    }
    else {
LAB_00139cf6:
      psVar6->obj_init = (void *)0x0;
    }
  }
  size = psVar6->cmn_size;
  ppVar5->cmn_size = size;
  if (__kmp_foreign_tp == 0) {
    if ((((gtid < 0) || (__kmp_root[(uint)gtid] == (kmp_root_t *)0x0)) ||
        (__kmp_threads[(uint)gtid] == (kmp_info_t *)0x0)) ||
       (__kmp_threads[(uint)gtid] != (__kmp_root[(uint)gtid]->r).r_uber_thread)) goto LAB_00139bdd;
  }
  else if (gtid != 0) {
LAB_00139bdd:
    pc_addr = ___kmp_allocate(size);
  }
  ppVar5->par_addr = pc_addr;
  __kmp_release_ticket_lock(&__kmp_global_lock,gtid);
  if (psVar6->cmn_size < pc_size) {
    __kmp_msg_format(&local_48,0x40085);
    __kmp_fatal();
  }
  pcVar1 = (__kmp_threads[gtid]->th).th_pri_common;
  uVar8 = (ulong)(uVar12 & 0xff8);
  ppVar2 = *(private_common **)((long)pcVar1->data + uVar8);
  ppVar5->next = ppVar2;
  *(private_common **)((long)pcVar1->data + uVar8) = ppVar5;
  ppkVar4 = __kmp_threads;
  ppVar5->link = (__kmp_threads[gtid]->th).th_pri_head;
  (ppkVar4[gtid]->th).th_pri_head = ppVar5;
  if (__kmp_foreign_tp == 0) {
    if (((-1 < gtid) && (__kmp_root[gtid] != (kmp_root_t *)0x0)) &&
       ((pkVar3 = ppkVar4[gtid], pkVar3 != (kmp_info_t *)0x0 &&
        (pkVar3 == (__kmp_root[gtid]->r).r_uber_thread)))) {
      return ppVar5;
    }
  }
  else if (gtid == 0) {
    return ppVar5;
  }
  p_Var9 = (kmpc_cctor)(psVar6->ct).ctor;
  if (psVar6->is_vec == 0) {
    if (p_Var9 != (kmpc_cctor)0x0) {
      (*p_Var9)(ppVar5->par_addr,ppVar2);
      return ppVar5;
    }
    p_Var9 = (psVar6->cct).cctor;
    pvVar7 = ppVar5->par_addr;
    if (p_Var9 == (kmpc_cctor)0x0) goto LAB_00139cd0;
    pvVar11 = psVar6->obj_init;
  }
  else {
    if (p_Var9 == (kmpc_cctor)0x0) {
      pvVar7 = ppVar5->par_addr;
      if ((psVar6->cct).cctor != (kmpc_cctor)0x0) {
        (*(psVar6->cct).cctor)(pvVar7,psVar6->obj_init);
        return ppVar5;
      }
LAB_00139cd0:
      if (pvVar7 == ppVar5->gbl_addr) {
        return ppVar5;
      }
      __kmp_copy_common_data(pvVar7,psVar6->pod_init);
      return ppVar5;
    }
    pvVar7 = ppVar5->par_addr;
    pvVar11 = (void *)psVar6->vec_len;
  }
  (*p_Var9)(pvVar7,pvVar11);
  return ppVar5;
}

Assistant:

struct private_common *kmp_threadprivate_insert(int gtid, void *pc_addr,
                                                void *data_addr,
                                                size_t pc_size) {
  struct private_common *tn, **tt;
  struct shared_common *d_tn;

  /* +++++++++ START OF CRITICAL SECTION +++++++++ */
  __kmp_acquire_lock(&__kmp_global_lock, gtid);

  tn = (struct private_common *)__kmp_allocate(sizeof(struct private_common));

  tn->gbl_addr = pc_addr;

  d_tn = __kmp_find_shared_task_common(
      &__kmp_threadprivate_d_table, gtid,
      pc_addr); /* Only the MASTER data table exists. */

  if (d_tn != 0) {
    /* This threadprivate variable has already been seen. */

    if (d_tn->pod_init == 0 && d_tn->obj_init == 0) {
      d_tn->cmn_size = pc_size;

      if (d_tn->is_vec) {
        if (d_tn->ct.ctorv != 0) {
          /* Construct from scratch so no prototype exists */
          d_tn->obj_init = 0;
        } else if (d_tn->cct.cctorv != 0) {
          /* Now data initialize the prototype since it was previously
           * registered */
          d_tn->obj_init = (void *)__kmp_allocate(d_tn->cmn_size);
          (void)(*d_tn->cct.cctorv)(d_tn->obj_init, pc_addr, d_tn->vec_len);
        } else {
          d_tn->pod_init = __kmp_init_common_data(data_addr, d_tn->cmn_size);
        }
      } else {
        if (d_tn->ct.ctor != 0) {
          /* Construct from scratch so no prototype exists */
          d_tn->obj_init = 0;
        } else if (d_tn->cct.cctor != 0) {
          /* Now data initialize the prototype since it was previously
             registered */
          d_tn->obj_init = (void *)__kmp_allocate(d_tn->cmn_size);
          (void)(*d_tn->cct.cctor)(d_tn->obj_init, pc_addr);
        } else {
          d_tn->pod_init = __kmp_init_common_data(data_addr, d_tn->cmn_size);
        }
      }
    }
  } else {
    struct shared_common **lnk_tn;

    d_tn = (struct shared_common *)__kmp_allocate(sizeof(struct shared_common));
    d_tn->gbl_addr = pc_addr;
    d_tn->cmn_size = pc_size;
    d_tn->pod_init = __kmp_init_common_data(data_addr, pc_size);
    /*
            d_tn->obj_init = 0;  // AC: commented out because __kmp_allocate
       zeroes the memory
            d_tn->ct.ctor = 0;
            d_tn->cct.cctor = 0;
            d_tn->dt.dtor = 0;
            d_tn->is_vec = FALSE;
            d_tn->vec_len = 0L;
    */
    lnk_tn = &(__kmp_threadprivate_d_table.data[KMP_HASH(pc_addr)]);

    d_tn->next = *lnk_tn;
    *lnk_tn = d_tn;
  }

  tn->cmn_size = d_tn->cmn_size;

  if ((__kmp_foreign_tp) ? (KMP_INITIAL_GTID(gtid)) : (KMP_UBER_GTID(gtid))) {
    tn->par_addr = (void *)pc_addr;
  } else {
    tn->par_addr = (void *)__kmp_allocate(tn->cmn_size);
  }

  __kmp_release_lock(&__kmp_global_lock, gtid);
/* +++++++++ END OF CRITICAL SECTION +++++++++ */

#ifdef USE_CHECKS_COMMON
  if (pc_size > d_tn->cmn_size) {
    KC_TRACE(
        10, ("__kmp_threadprivate_insert: THREADPRIVATE: %p (%" KMP_UINTPTR_SPEC
             " ,%" KMP_UINTPTR_SPEC ")\n",
             pc_addr, pc_size, d_tn->cmn_size));
    KMP_FATAL(TPCommonBlocksInconsist);
  }
#endif /* USE_CHECKS_COMMON */

  tt = &(__kmp_threads[gtid]->th.th_pri_common->data[KMP_HASH(pc_addr)]);

#ifdef KMP_TASK_COMMON_DEBUG
  if (*tt != 0) {
    KC_TRACE(
        10,
        ("__kmp_threadprivate_insert: WARNING! thread#%d: collision on %p\n",
         gtid, pc_addr));
  }
#endif
  tn->next = *tt;
  *tt = tn;

#ifdef KMP_TASK_COMMON_DEBUG
  KC_TRACE(10,
           ("__kmp_threadprivate_insert: thread#%d, inserted node %p on list\n",
            gtid, pc_addr));
  dump_list();
#endif

  /* Link the node into a simple list */

  tn->link = __kmp_threads[gtid]->th.th_pri_head;
  __kmp_threads[gtid]->th.th_pri_head = tn;

  if ((__kmp_foreign_tp) ? (KMP_INITIAL_GTID(gtid)) : (KMP_UBER_GTID(gtid)))
    return tn;

  /* if C++ object with copy constructor, use it;
   * else if C++ object with constructor, use it for the non-master copies only;
   * else use pod_init and memcpy
   *
   * C++ constructors need to be called once for each non-master thread on
   * allocate
   * C++ copy constructors need to be called once for each thread on allocate */

  /* C++ object with constructors/destructors; don't call constructors for
     master thread though */
  if (d_tn->is_vec) {
    if (d_tn->ct.ctorv != 0) {
      (void)(*d_tn->ct.ctorv)(tn->par_addr, d_tn->vec_len);
    } else if (d_tn->cct.cctorv != 0) {
      (void)(*d_tn->cct.cctorv)(tn->par_addr, d_tn->obj_init, d_tn->vec_len);
    } else if (tn->par_addr != tn->gbl_addr) {
      __kmp_copy_common_data(tn->par_addr, d_tn->pod_init);
    }
  } else {
    if (d_tn->ct.ctor != 0) {
      (void)(*d_tn->ct.ctor)(tn->par_addr);
    } else if (d_tn->cct.cctor != 0) {
      (void)(*d_tn->cct.cctor)(tn->par_addr, d_tn->obj_init);
    } else if (tn->par_addr != tn->gbl_addr) {
      __kmp_copy_common_data(tn->par_addr, d_tn->pod_init);
    }
  }
  /* !BUILD_OPENMP_C
      if (tn->par_addr != tn->gbl_addr)
          __kmp_copy_common_data( tn->par_addr, d_tn->pod_init ); */

  return tn;
}